

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall cmComputeLinkInformation::AddItem(cmComputeLinkInformation *this,LinkEntry *entry)

{
  string_view sVar1;
  bool bVar2;
  __type _Var3;
  TargetType TVar4;
  uint uVar5;
  string *config_00;
  ulong uVar6;
  cmXcFrameworkPlist *this_00;
  string_view sVar7;
  bool local_534;
  bool local_533;
  bool local_532;
  bool local_531;
  byte local_4e9;
  bool local_4a1;
  char local_43a [2];
  string local_438;
  cmXcFrameworkPlistLibrary *local_418;
  cmXcFrameworkPlistLibrary *library;
  optional<cmXcFrameworkPlist> plist;
  string xcFrameworkPath;
  undefined1 local_390 [8];
  LinkEntry libEntry;
  cmListFileBacktrace local_310;
  string local_300;
  undefined1 local_2e0 [8];
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> lib;
  ArtifactType artifact_1;
  FeatureDescriptor *local_288;
  void *local_280;
  ItemIsPath local_274;
  string local_270;
  byte local_249;
  string local_248;
  ItemIsPath local_224;
  cmListFileBacktrace local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_1f0;
  LinkEntry local_1c0;
  string local_158;
  string *local_138;
  string *libName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  byte local_102;
  allocator<char> local_101;
  string local_100;
  FeatureDescriptor *local_e0;
  void *local_d8;
  ItemIsPath local_cc;
  cmListFileBacktrace local_c8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_88;
  undefined1 local_58 [8];
  string exe;
  ArtifactType artifact;
  bool impexe;
  string *config;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *item;
  cmGeneratorTarget *tgt;
  LinkEntry *entry_local;
  cmComputeLinkInformation *this_local;
  
  item = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
         entry->Target;
  config_00 = &this->Config;
  local_4a1 = false;
  tgt = (cmGeneratorTarget *)entry;
  entry_local = (LinkEntry *)this;
  if ((cmGeneratorTarget *)item != (cmGeneratorTarget *)0x0) {
    local_4a1 = cmGeneratorTarget::IsExecutableWithExports((cmGeneratorTarget *)item);
  }
  exe.field_2._M_local_buf[0xf] = local_4a1;
  if (((local_4a1 != false) &&
      (bVar2 = cmGeneratorTarget::HasImportLibrary((cmGeneratorTarget *)item,config_00), !bVar2)) &&
     (bVar2 = cmValue::operator_cast_to_bool(&this->LoaderFlag), !bVar2)) {
    return;
  }
  if ((item == (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x0) || (bVar2 = cmGeneratorTarget::IsLinkable((cmGeneratorTarget *)item), !bVar2)
     ) {
    sVar1 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view
                      ((string *)&(tgt->IncludeDirectoriesCache)._M_t._M_impl.super__Rb_tree_header)
    ;
    sVar7 = (string_view)::cm::operator____s("FRAMEWORK",9);
    bVar2 = cmHasSuffix(sVar1,sVar7);
    local_531 = true;
    if (!bVar2) {
      _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &(tgt->IncludeDirectoriesCache)._M_t._M_impl.super__Rb_tree_header,
                              (anonymous_namespace)::DEFAULT_abi_cxx11_);
      local_532 = false;
      if (_Var3) {
        bVar2 = cmSystemTools::IsPathToFramework((string *)entry);
        local_532 = false;
        if (bVar2) {
          local_532 = cmGeneratorTarget::IsApple(this->Target);
        }
      }
      local_531 = local_532;
    }
    if (local_531 != false) {
      AddFrameworkItem(this,(LinkEntry *)tgt);
      return;
    }
    sVar1 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view
                      ((string *)&(tgt->IncludeDirectoriesCache)._M_t._M_impl.super__Rb_tree_header)
    ;
    sVar7 = (string_view)::cm::operator____s("XCFRAMEWORK",0xb);
    bVar2 = cmHasSuffix(sVar1,sVar7);
    local_533 = true;
    if (!bVar2) {
      _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &(tgt->IncludeDirectoriesCache)._M_t._M_impl.super__Rb_tree_header,
                              (anonymous_namespace)::DEFAULT_abi_cxx11_);
      local_534 = false;
      if (_Var3) {
        bVar2 = cmSystemTools::IsPathToXcFramework((string *)entry);
        local_534 = false;
        if (bVar2) {
          local_534 = cmGeneratorTarget::IsApple(this->Target);
        }
      }
      local_533 = local_534;
    }
    if (local_533 == false) {
      bVar2 = cmsys::SystemTools::FileIsFullPath((string *)entry);
      if (bVar2) {
        bVar2 = cmsys::SystemTools::FileIsDirectory((string *)entry);
        if (!bVar2) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->Depends,(value_type *)entry);
          AddFullItem(this,(LinkEntry *)tgt);
          AddLibraryRuntimeInfo(this,(string *)entry);
          return;
        }
        DropDirectoryItem(this,&entry->Item);
        return;
      }
      if (*(int *)&(tgt->IncludeDirectoriesCache)._M_t._M_impl == 1) {
        return;
      }
      AddUserItem(this,(LinkEntry *)tgt,true);
      return;
    }
    AddXcFrameworkItem(this,(LinkEntry *)tgt);
    return;
  }
  if (((exe.field_2._M_local_buf[0xf] & 1U) == 0) ||
     (bVar2 = cmValue::operator_cast_to_bool(&this->LoaderFlag), !bVar2)) {
    TVar4 = cmGeneratorTarget::GetType((cmGeneratorTarget *)item);
    if (TVar4 == INTERFACE_LIBRARY) {
      std::__cxx11::string::string((string *)&local_128);
      libName._4_4_ = 0;
      std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
      emplace_back<std::__cxx11::string,cmComputeLinkInformation::ItemIsPath,cmGeneratorTarget_const*&>
                ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                  *)this,&local_128,(ItemIsPath *)((long)&libName + 4),(cmGeneratorTarget **)&item);
      std::__cxx11::string::~string((string *)&local_128);
      cmGeneratorTarget::GetImportedLibName(&local_158,(cmGeneratorTarget *)item,config_00);
      local_138 = &local_158;
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        std::__cxx11::string::string((string *)&local_210,(string *)local_138);
        cmListFileBacktrace::cmListFileBacktrace(&local_220,&(entry->Item).Backtrace);
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                  (&local_1f0,&local_210,&local_220);
        cmComputeLinkDepends::LinkEntry::LinkEntry(&local_1c0,&local_1f0,(cmGeneratorTarget *)0x0);
        AddItem(this,&local_1c0);
        cmComputeLinkDepends::LinkEntry::~LinkEntry(&local_1c0);
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                  (&local_1f0);
        cmListFileBacktrace::~cmListFileBacktrace(&local_220);
        std::__cxx11::string::~string((string *)&local_210);
      }
      std::__cxx11::string::~string((string *)&local_158);
    }
    else {
      TVar4 = cmGeneratorTarget::GetType((cmGeneratorTarget *)item);
      if (TVar4 == OBJECT_LIBRARY) {
        local_224 = No;
        std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
        emplace_back<BT<std::__cxx11::string>const&,cmComputeLinkInformation::ItemIsPath,cmGeneratorTarget_const*&>
                  ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                    *)this,&entry->Item,&local_224,(cmGeneratorTarget **)&item);
      }
      else {
        uVar5 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x29])();
        local_249 = 0;
        local_4e9 = 0;
        if ((uVar5 & 1) != 0) {
          cmGeneratorTarget::GetImportedXcFrameworkPath
                    (&local_248,(cmGeneratorTarget *)item,config_00);
          local_249 = 1;
          local_4e9 = std::__cxx11::string::empty();
          local_4e9 = local_4e9 ^ 0xff;
        }
        if ((local_249 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_248);
        }
        if ((local_4e9 & 1) == 0) {
          bVar2 = cmGeneratorTarget::HasImportLibrary((cmGeneratorTarget *)item,config_00);
          lib.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi._0_4_ = (ArtifactType)bVar2;
          cmGeneratorTarget::GetFullPath
                    (&local_300,(cmGeneratorTarget *)item,config_00,
                     (ArtifactType)
                     lib.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                     TopEntry.
                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi,true);
          cmListFileBacktrace::cmListFileBacktrace(&local_310,&(entry->Item).Backtrace);
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                    ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_2e0,&local_300,&local_310);
          cmListFileBacktrace::~cmListFileBacktrace(&local_310);
          std::__cxx11::string::~string((string *)&local_300);
          bVar2 = cmGeneratorTarget::IsAIX((cmGeneratorTarget *)item);
          if (bVar2) {
            sVar1 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_2e0);
            bVar2 = cmHasLiteralSuffix<10ul>(sVar1,(char (*) [10])0x111595a);
            if ((!bVar2) ||
               ((ArtifactType)
                lib.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != ImportLibraryArtifact)) goto LAB_0088e248;
            libEntry.Feature.field_2._12_4_ = 1;
          }
          else {
LAB_0088e248:
            if (((this->LinkDependsNoShared & 1U) == 0) ||
               (TVar4 = cmGeneratorTarget::GetType((cmGeneratorTarget *)item),
               TVar4 != SHARED_LIBRARY)) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&this->Depends,(value_type *)local_2e0);
            }
            cmComputeLinkDepends::LinkEntry::LinkEntry((LinkEntry *)local_390,(LinkEntry *)tgt);
            BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
            operator=((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_390,
                      (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_2e0);
            AddTargetItem(this,(LinkEntry *)local_390);
            bVar2 = cmGeneratorTarget::IsApple((cmGeneratorTarget *)item);
            if ((bVar2) &&
               (bVar2 = cmGeneratorTarget::HasImportLibrary((cmGeneratorTarget *)item,config_00),
               bVar2)) {
              cmGeneratorTarget::GetFullPath
                        ((string *)((long)&xcFrameworkPath.field_2 + 8),(cmGeneratorTarget *)item,
                         config_00,RuntimeBinaryArtifact,true);
              AddLibraryRuntimeInfo
                        (this,(string *)((long)&xcFrameworkPath.field_2 + 8),
                         (cmGeneratorTarget *)item);
              std::__cxx11::string::~string((string *)(xcFrameworkPath.field_2._M_local_buf + 8));
            }
            else {
              AddLibraryRuntimeInfo(this,(string *)local_2e0,(cmGeneratorTarget *)item);
            }
            if (((item != (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)0x0) &&
                (TVar4 = cmGeneratorTarget::GetType((cmGeneratorTarget *)item),
                TVar4 == SHARED_LIBRARY)) &&
               (bVar2 = cmGeneratorTarget::IsDLLPlatform(this->Target), bVar2)) {
              AddRuntimeDLL(this,(cmGeneratorTarget *)item);
            }
            cmComputeLinkDepends::LinkEntry::~LinkEntry((LinkEntry *)local_390);
            libEntry.Feature.field_2._12_4_ = 0;
          }
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                    ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_2e0);
          if (libEntry.Feature.field_2._12_4_ != 0) {
            return;
          }
        }
        else {
          cmGeneratorTarget::GetImportedXcFrameworkPath
                    (&local_270,(cmGeneratorTarget *)item,config_00);
          local_274 = Yes;
          local_280 = (void *)0x0;
          _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&(tgt->IncludeDirectoriesCache)._M_t._M_impl.
                                      super__Rb_tree_header,
                                  (anonymous_namespace)::DEFAULT_abi_cxx11_);
          lib.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi._6_1_ = 0;
          if (_Var3) {
            std::allocator<char>::allocator();
            lib.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi._6_1_ = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&artifact_1,"__CMAKE_LINK_XCFRAMEWORK",
                       (allocator<char> *)
                       ((long)&lib.Backtrace.
                               super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi + 7));
          }
          else {
            std::__cxx11::string::string
                      ((string *)&artifact_1,
                       (string *)&(tgt->IncludeDirectoriesCache)._M_t._M_impl.super__Rb_tree_header)
            ;
          }
          local_288 = FindLibraryFeature(this,(string *)&artifact_1);
          std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
          ::
          emplace_back<std::__cxx11::string,cmComputeLinkInformation::ItemIsPath,cmGeneratorTarget_const*&,decltype(nullptr),cmComputeLinkInformation::FeatureDescriptor_const*>
                    ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                      *)this,&local_270,&local_274,(cmGeneratorTarget **)&item,&local_280,&local_288
                    );
          std::__cxx11::string::~string((string *)&artifact_1);
          if ((lib.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi._6_1_ & 1) != 0) {
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&lib.Backtrace.
                               super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi + 7));
          }
          std::__cxx11::string::~string((string *)&local_270);
        }
      }
    }
  }
  else {
    bVar2 = cmGeneratorTarget::HasImportLibrary((cmGeneratorTarget *)item,config_00);
    exe.field_2._8_4_ = ZEXT14(bVar2);
    cmGeneratorTarget::GetFullPath
              ((string *)local_58,(cmGeneratorTarget *)item,config_00,exe.field_2._8_4_,true);
    std::__cxx11::string::string((string *)&local_a8,(string *)local_58);
    cmListFileBacktrace::cmListFileBacktrace(local_c8,&(entry->Item).Backtrace);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
              (&local_88,&local_a8,local_c8);
    local_cc = Yes;
    local_d8 = (void *)0x0;
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &(tgt->IncludeDirectoriesCache)._M_t._M_impl.super__Rb_tree_header,
                            (anonymous_namespace)::DEFAULT_abi_cxx11_);
    local_102 = 0;
    if (_Var3) {
      std::allocator<char>::allocator();
      local_102 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,"__CMAKE_LINK_EXECUTABLE",&local_101);
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_100,
                 (string *)&(tgt->IncludeDirectoriesCache)._M_t._M_impl.super__Rb_tree_header);
    }
    local_e0 = FindLibraryFeature(this,&local_100);
    std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
    emplace_back<BT<std::__cxx11::string>,cmComputeLinkInformation::ItemIsPath,cmGeneratorTarget_const*&,decltype(nullptr),cmComputeLinkInformation::FeatureDescriptor_const*>
              ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                *)this,&local_88,&local_cc,(cmGeneratorTarget **)&item,&local_d8,&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    if ((local_102 & 1) != 0) {
      std::allocator<char>::~allocator(&local_101);
    }
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
              (&local_88);
    cmListFileBacktrace::~cmListFileBacktrace(local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Depends,(value_type *)local_58);
    std::__cxx11::string::~string((string *)local_58);
  }
  cmGeneratorTarget::GetImportedXcFrameworkPath
            ((string *)
             &plist.super__Optional_base<cmXcFrameworkPlist,_false,_false>._M_payload.
              super__Optional_payload<cmXcFrameworkPlist,_true,_false,_false>.
              super__Optional_payload_base<cmXcFrameworkPlist>._M_engaged,(cmGeneratorTarget *)item,
             config_00);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    cmParseXcFrameworkPlist
              ((optional<cmXcFrameworkPlist> *)&library,
               (string *)
               &plist.super__Optional_base<cmXcFrameworkPlist,_false,_false>._M_payload.
                super__Optional_payload<cmXcFrameworkPlist,_true,_false,_false>.
                super__Optional_payload_base<cmXcFrameworkPlist>._M_engaged,this->Makefile,
               &(entry->Item).Backtrace);
    bVar2 = std::optional::operator_cast_to_bool((optional *)&library);
    if (bVar2) {
      this_00 = std::optional<cmXcFrameworkPlist>::operator->
                          ((optional<cmXcFrameworkPlist> *)&library);
      local_418 = cmXcFrameworkPlist::SelectSuitableLibrary
                            (this_00,this->Makefile,&(entry->Item).Backtrace);
      if (local_418 == (cmXcFrameworkPlistLibrary *)0x0) {
        libEntry.Feature.field_2._12_4_ = 1;
      }
      else {
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          local_43a[1] = 0x2f;
          local_43a[0] = '/';
          cmStrCat<std::__cxx11::string&,char,std::__cxx11::string_const&,char,std::__cxx11::string_const&>
                    (&local_438,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &plist.super__Optional_base<cmXcFrameworkPlist,_false,_false>._M_payload.
                      super__Optional_payload<cmXcFrameworkPlist,_true,_false,_false>.
                      super__Optional_payload_base<cmXcFrameworkPlist>._M_engaged,local_43a + 1,
                     &local_418->LibraryIdentifier,local_43a,&local_418->HeadersPath);
          AddXcFrameworkHeaderPath(this,&local_438);
          std::__cxx11::string::~string((string *)&local_438);
        }
        libEntry.Feature.field_2._12_4_ = 0;
      }
    }
    else {
      libEntry.Feature.field_2._12_4_ = 1;
    }
    std::optional<cmXcFrameworkPlist>::~optional((optional<cmXcFrameworkPlist> *)&library);
    if (libEntry.Feature.field_2._12_4_ != 0) goto LAB_0088e630;
  }
  libEntry.Feature.field_2._12_4_ = 0;
LAB_0088e630:
  std::__cxx11::string::~string
            ((string *)
             &plist.super__Optional_base<cmXcFrameworkPlist,_false,_false>._M_payload.
              super__Optional_payload<cmXcFrameworkPlist,_true,_false,_false>.
              super__Optional_payload_base<cmXcFrameworkPlist>._M_engaged);
  return;
}

Assistant:

void cmComputeLinkInformation::AddItem(LinkEntry const& entry)
{
  cmGeneratorTarget const* tgt = entry.Target;
  BT<std::string> const& item = entry.Item;

  // Compute the proper name to use to link this library.
  const std::string& config = this->Config;
  bool impexe = (tgt && tgt->IsExecutableWithExports());
  if (impexe && !tgt->HasImportLibrary(config) && !this->LoaderFlag) {
    // Skip linking to executables on platforms with no import
    // libraries or loader flags.
    return;
  }

  if (tgt && tgt->IsLinkable()) {
    // This is a CMake target.  Ask the target for its real name.
    if (impexe && this->LoaderFlag) {
      // This link item is an executable that may provide symbols
      // used by this target.  A special flag is needed on this
      // platform.  Add it now using a special feature.
      cmStateEnums::ArtifactType artifact = tgt->HasImportLibrary(config)
        ? cmStateEnums::ImportLibraryArtifact
        : cmStateEnums::RuntimeBinaryArtifact;
      std::string exe = tgt->GetFullPath(config, artifact, true);
      this->Items.emplace_back(
        BT<std::string>(exe, item.Backtrace), ItemIsPath::Yes, tgt, nullptr,
        this->FindLibraryFeature(entry.Feature == DEFAULT
                                   ? "__CMAKE_LINK_EXECUTABLE"
                                   : entry.Feature));
      this->Depends.push_back(std::move(exe));
    } else if (tgt->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      // Add the interface library as an item so it can be considered as part
      // of COMPATIBLE_INTERFACE_ enforcement.  The generators will ignore
      // this for the actual link line.
      this->Items.emplace_back(std::string(), ItemIsPath::No, tgt);

      // Also add the item the interface specifies to be used in its place.
      std::string const& libName = tgt->GetImportedLibName(config);
      if (!libName.empty()) {
        this->AddItem(BT<std::string>(libName, item.Backtrace));
      }
    } else if (tgt->GetType() == cmStateEnums::OBJECT_LIBRARY) {
      this->Items.emplace_back(item, ItemIsPath::No, tgt);
    } else if (this->GlobalGenerator->IsXcode() &&
               !tgt->GetImportedXcFrameworkPath(config).empty()) {
      this->Items.emplace_back(
        tgt->GetImportedXcFrameworkPath(config), ItemIsPath::Yes, tgt, nullptr,
        this->FindLibraryFeature(entry.Feature == DEFAULT
                                   ? "__CMAKE_LINK_XCFRAMEWORK"
                                   : entry.Feature));
    } else {
      // Decide whether to use an import library.
      cmStateEnums::ArtifactType artifact = tgt->HasImportLibrary(config)
        ? cmStateEnums::ImportLibraryArtifact
        : cmStateEnums::RuntimeBinaryArtifact;

      // Pass the full path to the target file.
      BT<std::string> lib = BT<std::string>(
        tgt->GetFullPath(config, artifact, true), item.Backtrace);
      if (tgt->IsAIX() && cmHasLiteralSuffix(lib.Value, "-NOTFOUND") &&
          artifact == cmStateEnums::ImportLibraryArtifact) {
        // This is an imported executable on AIX that has ENABLE_EXPORTS
        // but not IMPORTED_IMPLIB.  CMake used to produce and accept such
        // imported executables on AIX before we taught it to use linker
        // import files.  For compatibility, simply skip linking to this
        // executable as we did before.  It works with runtime linking.
        return;
      }
      if (!this->LinkDependsNoShared ||
          tgt->GetType() != cmStateEnums::SHARED_LIBRARY) {
        this->Depends.push_back(lib.Value);
      }

      LinkEntry libEntry{ entry };
      libEntry.Item = lib;
      this->AddTargetItem(libEntry);
      if (tgt->IsApple() && tgt->HasImportLibrary(config)) {
        // Use the library rather than the tbd file for runpath computation
        this->AddLibraryRuntimeInfo(
          tgt->GetFullPath(config, cmStateEnums::RuntimeBinaryArtifact, true),
          tgt);
      } else {
        this->AddLibraryRuntimeInfo(lib.Value, tgt);
      }
      if (tgt && tgt->GetType() == cmStateEnums::SHARED_LIBRARY &&
          this->Target->IsDLLPlatform()) {
        this->AddRuntimeDLL(tgt);
      }
    }

    auto xcFrameworkPath = tgt->GetImportedXcFrameworkPath(config);
    if (!xcFrameworkPath.empty()) {
      auto plist = cmParseXcFrameworkPlist(xcFrameworkPath, *this->Makefile,
                                           item.Backtrace);
      if (!plist) {
        return;
      }
      if (auto const* library =
            plist->SelectSuitableLibrary(*this->Makefile, item.Backtrace)) {
        if (!library->HeadersPath.empty()) {
          this->AddXcFrameworkHeaderPath(cmStrCat(xcFrameworkPath, '/',
                                                  library->LibraryIdentifier,
                                                  '/', library->HeadersPath));
        }
      } else {
        return;
      }
    }
  } else {
    // This is not a CMake target.  Use the name given.
    if (cmHasSuffix(entry.Feature, "FRAMEWORK"_s) ||
        (entry.Feature == DEFAULT &&
         cmSystemTools::IsPathToFramework(item.Value) &&
         this->Target->IsApple())) {
      // This is a framework.
      this->AddFrameworkItem(entry);
    } else if (cmHasSuffix(entry.Feature, "XCFRAMEWORK"_s) ||
               (entry.Feature == DEFAULT &&
                cmSystemTools::IsPathToXcFramework(item.Value) &&
                this->Target->IsApple())) {
      // This is a framework.
      this->AddXcFrameworkItem(entry);
    } else if (cmSystemTools::FileIsFullPath(item.Value)) {
      if (cmSystemTools::FileIsDirectory(item.Value)) {
        // This is a directory.
        this->DropDirectoryItem(item);
      } else {
        // Use the full path given to the library file.
        this->Depends.push_back(item.Value);
        this->AddFullItem(entry);
        this->AddLibraryRuntimeInfo(item.Value);
      }
    } else if (entry.Kind != cmComputeLinkDepends::LinkEntry::Object) {
      // This is a library or option specified by the user.
      this->AddUserItem(entry, true);
    }
  }
}